

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cpp
# Opt level: O0

vector<field::GF2E,_std::allocator<field::GF2E>_> *
operator+(vector<field::GF2E,_std::allocator<field::GF2E>_> *lhs,
         vector<field::GF2E,_std::allocator<field::GF2E>_> *rhs)

{
  size_type sVar1;
  size_type sVar2;
  runtime_error *this;
  const_reference other;
  reference this_00;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_RDX;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_RSI;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_RDI;
  size_t i;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *result;
  ulong local_30;
  
  sVar1 = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::size(in_RSI);
  sVar2 = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::size(in_RDX);
  if (sVar1 == sVar2) {
    std::vector<field::GF2E,_std::allocator<field::GF2E>_>::vector(in_RSI,in_RDX);
    for (local_30 = 0; sVar1 = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::size(in_RSI),
        local_30 < sVar1; local_30 = local_30 + 1) {
      other = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[](in_RDX,local_30);
      this_00 = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[](in_RDI,local_30);
      field::GF2E::operator+=(this_00,other);
    }
    return in_RDI;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"adding vectors of different sizes");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<field::GF2E> operator+(const std::vector<field::GF2E> &lhs,
                                   const std::vector<field::GF2E> &rhs) {
  if (lhs.size() != rhs.size())
    throw std::runtime_error("adding vectors of different sizes");

  std::vector<field::GF2E> result(lhs);
  for (size_t i = 0; i < lhs.size(); i++)
    result[i] += rhs[i];

  return result;
}